

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall QPicturePaintEngine::updateOpacity(QPicturePaintEngine *this,qreal opacity)

{
  long lVar1;
  QPicturePaintEnginePrivate *pQVar2;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  int pos;
  QPicturePaintEnginePrivate *d;
  quint8 in_stack_ffffffffffffff9f;
  undefined1 in_stack_ffffffffffffffdf;
  QRectF *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  QPicturePaintEngine *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QPicturePaintEngine *)0x310020);
  pQVar2->pic_d->trecs = pQVar2->pic_d->trecs + 1;
  QDataStream::operator<<(in_RDI,in_stack_ffffffffffffff9f);
  QDataStream::operator<<(in_RDI,in_stack_ffffffffffffff9f);
  QBuffer::pos();
  QDataStream::operator<<(&pQVar2->s,in_XMM0_Qa);
  QRectF::QRectF((QRectF *)&stack0xffffffffffffffd8);
  writeCmdLength(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                 (bool)in_stack_ffffffffffffffdf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::updateOpacity(qreal opacity)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> updateOpacity():" << opacity;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcSetOpacity);
    d->s << double(opacity);
    writeCmdLength(pos, QRectF(), false);
}